

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDate __thiscall
QLocale::toDate(QLocale *this,QString *string,QString *format,QCalendar cal,int baseYear)

{
  long lVar1;
  bool bVar2;
  QString *in_RDX;
  QDateTimeParser *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QDateTimeParser dt;
  QDate date;
  QStringView in_stack_00000250;
  QLocale *in_stack_fffffffffffffeb8;
  QDateTimeParser *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QStringView *this_00;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QCalendar in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  QDateTimeParser *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  QDate::QDate((QDate *)in_stack_fffffffffffffec0);
  this_01 = (QDateTimeParser *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTimeParser::QDateTimeParser
            ((QDateTimeParser *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (Type)((ulong)in_RDI >> 0x20),(Context)in_RDI,in_stack_ffffffffffffff08);
  QDateTimeParser::setDefaultLocale(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QStringView::QStringView<QString,_true>
            (this_00,(QString *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  bVar2 = QDateTimeParser::parseFormat(this_01,in_stack_00000250);
  if (bVar2) {
    QDateTimeParser::fromString
              (in_RSI,in_RDX,(QDate *)CONCAT44(in_R8D,in_stack_ffffffffffffff10),
               (QTime *)in_stack_ffffffffffffff08.d_ptr,in_stack_ffffffffffffff04);
  }
  QDateTimeParser::~QDateTimeParser(in_stack_fffffffffffffec0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDate)-0x5555555555555556;
}

Assistant:

QDate QLocale::toDate(const QString &string, const QString &format, QCalendar cal, int baseYear) const
{
    QDate date;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QDate, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(*this);
    if (dt.parseFormat(format))
        dt.fromString(string, &date, nullptr, baseYear);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return date;
}